

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRandomUniformBlockCase.cpp
# Opt level: O0

void __thiscall
vkt::ubo::RandomUniformBlockCase::generateUniform
          (RandomUniformBlockCase *this,Random *rnd,UniformBlock *block)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int in_R8D;
  float fVar4;
  bool local_c9;
  Uniform local_b8;
  undefined1 local_68 [8];
  VarType type;
  string name;
  deUint32 flags;
  bool unusedOk;
  float unusedFragWeight;
  float unusedVtxWeight;
  UniformBlock *block_local;
  Random *rnd_local;
  RandomUniformBlockCase *this_local;
  
  uVar3 = this->m_features >> 9;
  ubo::(anonymous_namespace)::genName_abi_cxx11_
            ((string *)((long)&type.m_data + 8),(_anonymous_namespace_ *)0x61,'z',
             (char)this->m_uniformNdx,in_R8D);
  generateType((VarType *)local_68,this,rnd,0,true);
  bVar1 = false;
  if ((uVar3 & 1) != 0) {
    fVar4 = de::Random::getFloat(rnd);
    bVar1 = fVar4 < 0.15;
  }
  uVar2 = 0;
  if (bVar1) {
    uVar2 = 0x800;
  }
  local_c9 = false;
  if ((uVar3 & 1) != 0) {
    fVar4 = de::Random::getFloat(rnd);
    local_c9 = fVar4 < 0.15;
  }
  Uniform::Uniform(&local_b8,(string *)((long)&type.m_data + 8),(VarType *)local_68,
                   uVar2 | (uint)local_c9 << 0xc);
  UniformBlock::addUniform(block,&local_b8);
  Uniform::~Uniform(&local_b8);
  this->m_uniformNdx = this->m_uniformNdx + 1;
  VarType::~VarType((VarType *)local_68);
  std::__cxx11::string::~string((string *)((long)&type.m_data + 8));
  return;
}

Assistant:

void RandomUniformBlockCase::generateUniform (de::Random& rnd, UniformBlock& block)
{
	const float		unusedVtxWeight		= 0.15f;
	const float		unusedFragWeight	= 0.15f;
	bool			unusedOk			= (m_features & FEATURE_UNUSED_UNIFORMS) != 0;
	deUint32		flags				= 0;
	std::string		name				= genName('a', 'z', m_uniformNdx);
	VarType			type				= generateType(rnd, 0, true);

	flags |= (unusedOk && rnd.getFloat() < unusedVtxWeight)		? UNUSED_VERTEX		: 0;
	flags |= (unusedOk && rnd.getFloat() < unusedFragWeight)	? UNUSED_FRAGMENT	: 0;

	block.addUniform(Uniform(name, type, flags));

	m_uniformNdx += 1;
}